

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O3

void __thiscall
MppMemService::add_log
          (MppMemService *this,MppMemOps ops,char *caller,void *ptr,void *ret,size_t size_0,
          size_t size_1)

{
  RK_U32 RVar1;
  MppMemService *pMVar2;
  int iVar3;
  int iVar4;
  MppMemLog *pMVar5;
  
  pMVar2 = get_inst();
  iVar3 = this->log_idx;
  pMVar5 = this->logs + iVar3;
  if ((pMVar2->debug & 2) != 0) {
    _mpp_log_l(4,"mpp_mem","%-7s ptr %010p %010p size %8u %8u at %s\n",(char *)0x0,ops2str[ops],ptr,
               ret,size_0,size_1,caller);
    iVar3 = this->log_idx;
  }
  RVar1 = this->log_index;
  this->log_index = RVar1 + 1;
  pMVar5->index = RVar1;
  pMVar5->ops = ops;
  pMVar5->size_0 = size_0;
  pMVar5->size_1 = size_1;
  pMVar5->ptr = ptr;
  pMVar5->ret = ret;
  pMVar5->node = (MppMemNode *)0x0;
  pMVar5->caller = caller;
  iVar4 = 0;
  if (iVar3 + 1 < this->log_max) {
    iVar4 = iVar3 + 1;
  }
  this->log_idx = iVar4;
  if (this->log_cnt < this->log_max) {
    this->log_cnt = this->log_cnt + 1;
  }
  return;
}

Assistant:

void MppMemService::add_log(MppMemOps ops, const char *caller,
                            void *ptr, void *ret, size_t size_0, size_t size_1)
{
    MppMemService *srv = MppMemService::get_inst();
    MppMemLog *log = &logs[log_idx];

    if (srv->debug & MEM_RUNTIME_LOG)
        mpp_log("%-7s ptr %010p %010p size %8u %8u at %s\n",
                ops2str[ops], ptr, ret, size_0, size_1, caller);

    log->index  = log_index++;
    log->ops    = ops;
    log->size_0 = size_0;
    log->size_1 = size_1;
    log->ptr    = ptr;
    log->ret    = ret;
    log->node   = NULL;
    log->caller = caller;

    log_idx++;
    if (log_idx >= log_max)
        log_idx = 0;

    if (log_cnt < log_max)
        log_cnt++;
}